

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  float fVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  ImVec2 IVar4;
  bool bVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  ImU32 col;
  byte bVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 label_size;
  ImGuiLastItemData last_item_backup;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  char *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined4 uStack_60;
  float local_5c;
  float fStack_58;
  ImVec2 IStack_54;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar6 = GImGui;
  local_b0 = frame_padding;
  local_90 = label;
  local_b8 = CalcTextSize(label,(char *)0x0,true,-1.0);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar12 = (bb->Min).x;
  fVar15 = (bb->Max).x;
  if (1.0 < fVar15 - fVar12) {
    local_c0.y = (bb->Max).y;
    fVar14 = local_b0.x;
    fVar12 = fVar12 + fVar14;
    fVar15 = fVar15 - fVar14;
    local_c8.y = (bb->Min).y + local_b0.y;
    local_c8.x = fVar12;
    if (out_text_clipped != (bool *)0x0) {
      *out_text_clipped = fVar15 < fVar12 + local_b8.x;
    }
    fVar12 = pIVar6->FontSize;
    fVar13 = (bb->Min).x;
    local_d0.y = (bb->Min).y;
    fVar1 = (bb->Max).x;
    fVar14 = (fVar1 - (fVar14 + fVar14)) - fVar12;
    uVar11 = -(uint)(fVar14 <= fVar13);
    local_d0.x = (float)(uVar11 & (uint)fVar13 | ~uVar11 & (uint)fVar14);
    if (((close_button_id == 0) ||
        ((!is_contents_visible &&
         (fVar14 = (pIVar6->Style).TabMinWidthForCloseButton, uVar11 = -(uint)(fVar14 <= fVar12),
         fVar1 - fVar13 < (float)(~uVar11 & (uint)fVar14 | uVar11 & (uint)fVar12))))) ||
       ((pIVar6->HoveredId != close_button_id && pIVar6->HoveredId != tab_id &&
        (pIVar6->ActiveId != tab_id && pIVar6->ActiveId != close_button_id)))) {
      bVar5 = false;
    }
    else {
      bVar5 = true;
    }
    bVar10 = local_d0.x + fVar12 <= fVar1 & (byte)flags;
    local_c0.x = fVar15;
    if (bVar5) {
      local_a8 = ZEXT416((uint)fVar12);
      local_88._0_4_ = (pIVar6->LastItemData).ID;
      local_88._4_4_ = (pIVar6->LastItemData).InFlags;
      uStack_80._0_4_ = (pIVar6->LastItemData).StatusFlags;
      uStack_80._4_4_ = (pIVar6->LastItemData).Rect.Min.x;
      local_78 = *(undefined8 *)&(pIVar6->LastItemData).Rect.Min.y;
      uStack_70 = *(undefined8 *)&(pIVar6->LastItemData).Rect.Max.y;
      uStack_68 = *(undefined8 *)&(pIVar6->LastItemData).NavRect.Min.y;
      uVar3 = *(undefined8 *)&(pIVar6->LastItemData).NavRect.Max.y;
      IStack_54 = (pIVar6->LastItemData).DisplayRect.Max;
      fStack_58 = (pIVar6->LastItemData).DisplayRect.Min.y;
      uStack_60 = (undefined4)uVar3;
      local_5c = (float)((ulong)uVar3 >> 0x20);
      PushStyleVar(0xb,&local_b0);
      bVar7 = CloseButton(close_button_id,&local_d0);
      PopStyleVar(1);
      IVar4.y = fStack_58;
      IVar4.x = local_5c;
      (pIVar6->LastItemData).DisplayRect.Min = IVar4;
      (pIVar6->LastItemData).DisplayRect.Max = IStack_54;
      *(undefined8 *)&(pIVar6->LastItemData).NavRect.Min.y = uStack_68;
      *(ulong *)&(pIVar6->LastItemData).NavRect.Max.y = CONCAT44(local_5c,uStack_60);
      *(undefined8 *)&(pIVar6->LastItemData).Rect.Min.y = local_78;
      *(undefined8 *)&(pIVar6->LastItemData).Rect.Max.y = uStack_70;
      (pIVar6->LastItemData).ID = (undefined4)local_88;
      (pIVar6->LastItemData).InFlags = local_88._4_4_;
      (pIVar6->LastItemData).StatusFlags = (undefined4)uStack_80;
      (pIVar6->LastItemData).Rect.Min.x = (float)uStack_80._4_4_;
      if ((flags & 4U) == 0) {
        bVar8 = IsMouseClicked(2,false);
        if (bVar8) {
          bVar7 = true;
        }
      }
      fVar12 = (float)local_a8._0_4_;
      bVar9 = 1;
    }
    else {
      bVar9 = bVar10;
      if (bVar10 == 0) {
        bVar7 = false;
      }
      else {
        IVar2 = (pIVar6->Style).FramePadding;
        fVar14 = IVar2.x;
        fVar13 = IVar2.y;
        local_48 = (local_d0.x + local_d0.x + fVar12 + fVar14 + fVar14) * 0.5;
        fStack_44 = (local_d0.y + local_d0.y + fVar12 + fVar13 + fVar13) * 0.5;
        uStack_40 = 0;
        uStack_3c = 0;
        bVar7 = false;
        local_a8 = ZEXT416((uint)fVar12);
        col = GetColorU32(0,1.0);
        IVar2.y = fStack_44;
        IVar2.x = local_48;
        RenderBullet(draw_list,IVar2,col);
        fVar12 = (float)local_a8._0_4_;
      }
    }
    fVar14 = fVar15;
    if (!bVar5) {
      fVar14 = (bb->Max).x + -1.0;
    }
    if (bVar9 != 0) {
      fVar14 = fVar12 * 0.8;
      if (!bVar5) {
        fVar12 = fVar14;
      }
      if (bVar10 == 0) {
        fVar14 = 0.0;
      }
      fVar15 = fVar15 - fVar12;
      local_c0.x = local_c0.x - fVar14;
      fVar14 = fVar15;
    }
    RenderTextEllipsis(draw_list,&local_c8,&local_c0,fVar15,fVar14,local_90,(char *)0x0,&local_b8);
    if (out_just_closed != (bool *)0x0) {
      *out_just_closed = bVar7;
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    const float button_sz = g.FontSize;
    const ImVec2 button_pos(ImMax(bb.Min.x, bb.Max.x - frame_padding.x * 2.0f - button_sz), bb.Min.y);

    // Close Button & Unsaved Marker
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= ImMax(button_sz, g.Style.TabMinWidthForCloseButton))
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    bool unsaved_marker_visible = (flags & ImGuiTabItemFlags_UnsavedDocument) != 0 && (button_pos.x + button_sz <= bb.Max.x);

    if (close_button_visible)
    {
        ImGuiLastItemData last_item_backup = g.LastItemData;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, button_pos))
            close_button_pressed = true;
        PopStyleVar();
        g.LastItemData = last_item_backup;

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;
    }
    else if (unsaved_marker_visible)
    {
        const ImRect bullet_bb(button_pos, button_pos + ImVec2(button_sz, button_sz) + g.Style.FramePadding * 2.0f);
        RenderBullet(draw_list, bullet_bb.GetCenter(), GetColorU32(ImGuiCol_Text));
    }

    // This is all rather complicated
    // (the main idea is that because the close button only appears on hover, we don't want it to alter the ellipsis position)
    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    if (close_button_visible || unsaved_marker_visible)
    {
        text_pixel_clip_bb.Max.x -= close_button_visible ? (button_sz) : (button_sz * 0.80f);
        text_ellipsis_clip_bb.Max.x -= unsaved_marker_visible ? (button_sz * 0.80f) : 0.0f;
        ellipsis_max_x = text_pixel_clip_bb.Max.x;
    }
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}